

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbutton.cpp
# Opt level: O0

void __thiscall QToolButtonPrivate::onActionTriggered(QToolButtonPrivate *this)

{
  QAction *_t1;
  QToolButtonPrivate *in_RDI;
  QAction *action;
  QToolButton *q;
  
  q_func(in_RDI);
  QObject::sender();
  _t1 = qobject_cast<QAction*>((QObject *)0x70a0be);
  if (_t1 != (QAction *)0x0) {
    QToolButton::triggered((QToolButton *)0x70a0d7,_t1);
  }
  return;
}

Assistant:

void QToolButtonPrivate::onActionTriggered()
{
    Q_Q(QToolButton);
    if (QAction *action = qobject_cast<QAction *>(q->sender()))
        emit q->triggered(action);
}